

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::GammaCorrection
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma)

{
  char *message;
  reference pvVar1;
  uint32_t in_EDX;
  undefined8 unaff_RBX;
  uint32_t in_ESI;
  Image *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  Image *unaff_retaddr;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000020;
  double data;
  uint16_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  allocator_type *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff77;
  size_type in_stack_ffffffffffffff78;
  double dVar4;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined8 in_stack_ffffffffffffff88;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  ushort local_64;
  undefined1 local_61;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff90,(uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (uint32_t)(in_stack_ffffffffffffff78 >> 0x20),(uint32_t)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  if ((0.0 <= in_XMM0_Qa) && (0.0 <= in_XMM1_Qa)) {
    local_61 = 0xff;
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff9e;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1221de);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this,in_stack_ffffffffffffff78,
               (value_type_conflict *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x122203);
    for (local_64 = 0; local_64 < 0x100; local_64 = local_64 + 1) {
      dVar4 = in_XMM0_Qa;
      dVar2 = pow((double)local_64 / 255.0,in_XMM1_Qa);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar4 * dVar2;
      auVar3 = vfmadd213sd_fma(ZEXT816(0x406fe00000000000),auVar3,ZEXT816(0x3fe0000000000000));
      if (auVar3._0_8_ < 256.0) {
        in_stack_ffffffffffffff77 = (value_type)(int)auVar3._0_8_;
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &stack0xffffffffffffffa0,(ulong)local_64);
        *pvVar1 = in_stack_ffffffffffffff77;
      }
    }
    LookupTable(unaff_retaddr,(uint32_t)((ulong)unaff_RBX >> 0x20),(uint32_t)unaff_RBX,in_RDI,in_ESI
                ,in_EDX,in_stack_00000010,in_stack_00000018,in_stack_00000020);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    return;
  }
  message = (char *)__cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)in_stack_ffffffffffffff90,message);
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                          uint32_t width, uint32_t height, double a, double gamma )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        if( a < 0 || gamma < 0 )
            throw imageException( "Gamma correction parameters are invalid" );

        // We precalculate all values and store them in lookup table
        std::vector < uint8_t > value( 256, 255u );

        for( uint16_t i = 0; i < 256; ++i ) {
            double data = a * pow( i / 255.0, gamma ) * 255 + 0.5;

            if( data < 256 )
                value[i] = static_cast<uint8_t>(data);
        }

        LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
    }